

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O3

void ldisc_check_sendok_callback(void *ctx)

{
  bufchain *ch;
  char cVar1;
  size_t sVar2;
  void *__s;
  void *pvVar3;
  ptrlen pVar4;
  LdiscInputToken local_40;
  
  if (*(long **)((long)ctx + 8) != (long *)0x0) {
    cVar1 = (**(code **)(**(long **)((long)ctx + 8) + 0x50))();
    if (cVar1 != '\0') {
      ch = (bufchain *)((long)ctx + 0x18);
      sVar2 = bufchain_size(ch);
      if (sVar2 != 0) {
        do {
          pVar4 = bufchain_prefix(ch);
          __s = pVar4.ptr;
          pvVar3 = memchr(__s,-1,pVar4.len);
          if ((long)pvVar3 - (long)__s == 0) {
            local_40 = ldisc_get_input_token((Ldisc *)ctx);
            if (((undefined1  [12])local_40 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              (**(code **)(**(long **)((long)ctx + 8) + 0x18))
                        (*(long **)((long)ctx + 8),&local_40.field_1,1);
            }
            else {
              (**(code **)(**(long **)((long)ctx + 8) + 0x30))
                        (*(long **)((long)ctx + 8),local_40.field_1._0_4_);
            }
          }
          else {
            sVar2 = (long)pvVar3 - (long)__s;
            if (pvVar3 == (void *)0x0) {
              sVar2 = pVar4.len;
            }
            (**(code **)(**(long **)((long)ctx + 8) + 0x18))(*(long **)((long)ctx + 8),__s,sVar2);
            bufchain_consume(ch,sVar2);
          }
          sVar2 = bufchain_size(ch);
        } while (sVar2 != 0);
      }
    }
  }
  return;
}

Assistant:

static void ldisc_check_sendok_callback(void *ctx)
{
    Ldisc *ldisc = (Ldisc *)ctx;

    if (!(ldisc->backend && backend_sendok(ldisc->backend)))
        return;

    /*
     * Flush the ldisc input queue into the backend, which is now
     * willing to receive the data.
     */
    while (bufchain_size(&ldisc->input_queue) > 0) {
        /*
         * Process either a chunk of non-special data, or an FF
         * escape, depending on whether the first thing we see is an
         * FF byte.
         */
        ptrlen data = bufchain_prefix(&ldisc->input_queue);
        const char *ff = memchr(data.ptr, '\xFF', data.len);
        if (ff != data.ptr) {
            /* Send a maximal block of data not containing any
             * difficult bytes. */
            if (ff)
                data.len = ff - (const char *)data.ptr;
            backend_send(ldisc->backend, data.ptr, data.len);
            bufchain_consume(&ldisc->input_queue, data.len);
        } else {
            /* Decode either a special or an escaped FF byte. The
             * easiest way to do this is to reuse the decoding code
             * already in ldisc_get_input_token. */
            LdiscInputToken tok = ldisc_get_input_token(ldisc);
            if (tok.is_special)
                backend_special(ldisc->backend, tok.code, tok.arg);
            else
                backend_send(ldisc->backend, &tok.chr, 1);
        }
    }
}